

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O0

void __thiscall
Bech32Test_ensure_correct_data_size_high_Test::~Bech32Test_ensure_correct_data_size_high_Test
          (Bech32Test_ensure_correct_data_size_high_Test *this)

{
  Bech32Test_ensure_correct_data_size_high_Test *this_local;
  
  ~Bech32Test_ensure_correct_data_size_high_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, ensure_correct_data_size_high) {
    std::string data(89, 'a');
    EXPECT_NO_THROW(rejectBStringTooLong(data));

    data.append(1, 'a');
    EXPECT_NO_THROW(rejectBStringTooLong(data));

    data.append(1, 'a');
    EXPECT_THROW(rejectBStringTooLong(data), std::runtime_error);
}